

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

void __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::parseOpeningXMLElement
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this)

{
  char cVar1;
  char *c;
  char *c_00;
  char *pcVar2;
  char *c_01;
  bool bVar3;
  bool bVar4;
  byte local_c1;
  string<char> local_b8;
  undefined1 local_a8 [24];
  string<char> s;
  string<char> local_78;
  undefined1 local_68 [8];
  SAttribute attr;
  char *attributeValueEnd;
  char *attributeValueBegin;
  u32 uStack_30;
  char attributeQuoteChar;
  char *attributeNameEnd;
  char *attributeNameBegin;
  char *endName;
  char *startName;
  CXMLReaderImpl<char,_irr::io::IXMLBase> *this_local;
  
  this->CurrentNodeType = EXN_ELEMENT;
  this->IsEmptyElement = false;
  core::array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute>::clear
            (&this->Attributes);
  c = this->P;
  while( true ) {
    local_c1 = 0;
    if (*this->P != '>') {
      bVar3 = isWhiteSpace(this,*this->P);
      local_c1 = bVar3 ^ 0xff;
    }
    if ((local_c1 & 1) == 0) break;
    this->P = this->P + 1;
  }
  attributeNameBegin = this->P;
LAB_00b8e0b3:
  do {
    if (*this->P == '>') {
LAB_00b8e401:
      if ((c < attributeNameBegin) && (attributeNameBegin[-1] == '/')) {
        this->IsEmptyElement = true;
        attributeNameBegin = attributeNameBegin + -1;
      }
      core::string<char>::string<char>(&local_b8,c,(int)attributeNameBegin - (int)c);
      core::string<char>::operator=(&this->NodeName,&local_b8);
      core::string<char>::~string(&local_b8);
      this->P = this->P + 1;
      return;
    }
    bVar3 = isWhiteSpace(this,*this->P);
    if (bVar3) {
      this->P = this->P + 1;
      goto LAB_00b8e0b3;
    }
    if (*this->P == '/') {
      this->P = this->P + 1;
      this->IsEmptyElement = true;
      goto LAB_00b8e401;
    }
    c_00 = this->P;
    while( true ) {
      bVar4 = isWhiteSpace(this,*this->P);
      bVar3 = false;
      if (!bVar4) {
        bVar3 = *this->P != '=';
      }
      if (!bVar3) break;
      this->P = this->P + 1;
    }
    pcVar2 = this->P;
    this->P = this->P + 1;
    while( true ) {
      bVar3 = false;
      if ((*this->P != '\"') && (bVar3 = false, *this->P != '\'')) {
        bVar3 = *this->P != '\0';
      }
      if (!bVar3) break;
      this->P = this->P + 1;
    }
    if (*this->P == '\0') {
      return;
    }
    cVar1 = *this->P;
    this->P = this->P + 1;
    c_01 = this->P;
    while( true ) {
      bVar3 = false;
      if (*this->P != cVar1) {
        bVar3 = *this->P != '\0';
      }
      if (!bVar3) break;
      this->P = this->P + 1;
    }
    if (*this->P == '\0') {
      return;
    }
    attr.Value._8_8_ = this->P;
    this->P = this->P + 1;
    SAttribute::SAttribute((SAttribute *)local_68);
    uStack_30 = (u32)pcVar2;
    core::string<char>::string<char>(&local_78,c_00,uStack_30 - (int)c_00);
    core::string<char>::operator=((string<char> *)local_68,&local_78);
    core::string<char>::~string(&local_78);
    core::string<char>::string<char>
              ((string<char> *)(local_a8 + 0x10),c_01,attr.Value.allocated - (int)c_01);
    replaceSpecialCharacters
              ((CXMLReaderImpl<char,_irr::io::IXMLBase> *)local_a8,(string<char> *)this);
    core::string<char>::operator=((string<char> *)&attr.Name.allocated,(string<char> *)local_a8);
    core::string<char>::~string((string<char> *)local_a8);
    core::array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute>::push_back
              (&this->Attributes,(SAttribute *)local_68);
    core::string<char>::~string((string<char> *)(local_a8 + 0x10));
    SAttribute::~SAttribute((SAttribute *)local_68);
  } while( true );
}

Assistant:

void parseOpeningXMLElement()
	{
		CurrentNodeType = EXN_ELEMENT;
		IsEmptyElement = false;
		Attributes.clear();

		// find name
		const char_type* startName = P;

		// find end of element
		while(*P != L'>' && !isWhiteSpace(*P))
			++P;

		const char_type* endName = P;

		// find Attributes
		while(*P != L'>')
		{
			if (isWhiteSpace(*P))
				++P;
			else
			{
				if (*P != L'/')
				{
					// we've got an attribute

					// read the attribute names
					const char_type* attributeNameBegin = P;

					while(!isWhiteSpace(*P) && *P != L'=')
						++P;

					const char_type* attributeNameEnd = P;
					++P;

					// read the attribute value
					// check for quotes and single quotes, thx to murphy
					while( (*P != L'\"') && (*P != L'\'') && *P) 
						++P;

					if (!*P) // malformatted xml file
						return;

					const char_type attributeQuoteChar = *P;

					++P;
					const char_type* attributeValueBegin = P;
					
					while(*P != attributeQuoteChar && *P)
						++P;

					if (!*P) // malformatted xml file
						return;

					const char_type* attributeValueEnd = P;
					++P;

					SAttribute attr;
					attr.Name = core::string<char_type>(attributeNameBegin, 
						(int)(attributeNameEnd - attributeNameBegin));

					core::string<char_type> s(attributeValueBegin, 
						(int)(attributeValueEnd - attributeValueBegin));

					attr.Value = replaceSpecialCharacters(s);
					Attributes.push_back(attr);
				}
				else
				{
					// tag is closed directly
					++P;
					IsEmptyElement = true;
					break;
				}
			}
		}

		// check if this tag is closing directly
		if (endName > startName && *(endName-1) == L'/')
		{
			// directly closing tag
			IsEmptyElement = true;
			endName--;
		}
		
		NodeName = core::string<char_type>(startName, (int)(endName - startName));

		++P;
	}